

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject_test_app.cpp
# Opt level: O2

void __thiscall Snake::crawl(Snake *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"[");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar1 = std::operator<<(poVar1,"] Called ");
  poVar1 = std::operator<<(poVar1,"crawl");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

virtual void crawl() { LOG_FUNCTION_CALL(); }